

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreClient.cpp
# Opt level: O2

Enum __thiscall
ViconDataStreamSDK::Core::VClient::GetCentroidWeight
          (VClient *this,string *i_rCameraName,uint i_CentroidIndex,double *o_rWeight)

{
  pointer pfVar1;
  Enum EVar2;
  bool bVar3;
  VCameraInfo *pVVar4;
  VCentroidWeights *pVVar5;
  Enum GetResult;
  scoped_lock Lock;
  Enum local_34;
  unique_lock<boost::recursive_mutex> local_30;
  
  boost::unique_lock<boost::recursive_mutex>::unique_lock(&local_30,&this->m_FrameMutex);
  local_34 = Success;
  bVar3 = InitGet<double>(this,&local_34,o_rWeight);
  if (bVar3) {
    pVVar4 = GetCamera(this,i_rCameraName,&local_34);
    if (pVVar4 != (VCameraInfo *)0x0) {
      pVVar5 = GetCentroidWeightSet(this,pVVar4->m_CameraID,&local_34);
      if (pVVar5 != (VCentroidWeights *)0x0) {
        pfVar1 = (pVVar5->m_Weights).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((ulong)i_CentroidIndex <
            (ulong)((long)(pVVar5->m_Weights).super__Vector_base<float,_std::allocator<float>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)pfVar1 >> 2)) {
          *o_rWeight = (double)pfVar1[i_CentroidIndex];
        }
        else {
          local_34 = InvalidIndex;
        }
      }
    }
  }
  EVar2 = local_34;
  boost::unique_lock<boost::recursive_mutex>::~unique_lock(&local_30);
  return EVar2;
}

Assistant:

Result::Enum VClient::GetCentroidWeight( const std::string & i_rCameraName,
  const unsigned int i_CentroidIndex,
  double & o_rWeight ) const
{
  boost::recursive_mutex::scoped_lock Lock( m_FrameMutex );

  Result::Enum GetResult = Result::Success;
  if( InitGet( GetResult, o_rWeight ) )
  {
    const ViconCGStream::VCameraInfo* pCamera = GetCamera( i_rCameraName, GetResult );
    if( !pCamera )
    {
      return GetResult;
    }

    const ViconCGStream::VCentroidWeights* pCentroidWeightSet = GetCentroidWeightSet( pCamera->m_CameraID, GetResult );
    if( pCentroidWeightSet )
    {
      if( i_CentroidIndex < pCentroidWeightSet->m_Weights.size() )
      {
        o_rWeight = pCentroidWeightSet->m_Weights[i_CentroidIndex];;
      }
      else
      {
        GetResult = Result::InvalidIndex;
      }
    }
  }
  return GetResult;
}